

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void checkAppendMsg(IntegrityCk *pCheck,char *zFormat,...)

{
  StrAccum *p;
  uint uVar1;
  char in_AL;
  uint uVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  long in_FS_OFFSET;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 auStack_e8 [16];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined4 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  long local_20;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Da;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  checkProgress(pCheck);
  if (pCheck->mxErr != 0) {
    pCheck->mxErr = pCheck->mxErr + -1;
    pCheck->nErr = pCheck->nErr + 1;
    puStack_30 = &stack0x00000008;
    local_38 = (undefined1 *)0x3000000010;
    p = &pCheck->errMsg;
    local_28 = auStack_e8;
    if ((pCheck->errMsg).nChar != 0) {
      uVar1 = (pCheck->errMsg).nChar;
      uVar2 = uVar1 + 1;
      if (uVar2 < (pCheck->errMsg).nAlloc) {
        (pCheck->errMsg).nChar = uVar2;
        (pCheck->errMsg).zText[uVar1] = '\n';
        local_28 = auStack_e8;
      }
      else {
        local_28 = auStack_e8;
        enlargeAndAppend(p,"\n",1);
      }
    }
    if (pCheck->zPfx != (char *)0x0) {
      sqlite3_str_appendf(p,pCheck->zPfx,(ulong)pCheck->v0,(ulong)pCheck->v1,(ulong)(uint)pCheck->v2
                         );
    }
    sqlite3_str_vappendf(p,zFormat,(__va_list_tag *)&local_38);
    if ((pCheck->errMsg).accError == '\a') {
      pCheck->rc = 7;
      pCheck->mxErr = 0;
      if (pCheck->nErr == 0) {
        pCheck->nErr = 1;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void checkAppendMsg(
  IntegrityCk *pCheck,
  const char *zFormat,
  ...
){
  va_list ap;
  checkProgress(pCheck);
  if( !pCheck->mxErr ) return;
  pCheck->mxErr--;
  pCheck->nErr++;
  va_start(ap, zFormat);
  if( pCheck->errMsg.nChar ){
    sqlite3_str_append(&pCheck->errMsg, "\n", 1);
  }
  if( pCheck->zPfx ){
    sqlite3_str_appendf(&pCheck->errMsg, pCheck->zPfx,
                        pCheck->v0, pCheck->v1, pCheck->v2);
  }
  sqlite3_str_vappendf(&pCheck->errMsg, zFormat, ap);
  va_end(ap);
  if( pCheck->errMsg.accError==SQLITE_NOMEM ){
    checkOom(pCheck);
  }
}